

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O0

void __thiscall
soplex::
SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxGeometSC(SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *old)

{
  cpp_dec_float<200U,_int,_void> *in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxScaler((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_RSI,
              (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_RDI);
  *(undefined ***)(in_RDI->data)._M_elems = &PTR_setup_008a0d60;
  *(byte *)((in_RDI->data)._M_elems + 0x10) = (byte)(in_RSI->data)._M_elems[0x10] & 1;
  (in_RDI->data)._M_elems[0x11] = (in_RSI->data)._M_elems[0x11];
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RSI,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RSI,in_RDI);
  return;
}

Assistant:

SPxGeometSC<R>::SPxGeometSC(const SPxGeometSC<R>& old)
   : SPxScaler<R>(old)
   , postequilibration(old.postequilibration)
   , m_maxIterations(old.m_maxIterations)
   , m_minImprovement(old.m_minImprovement)
   , m_goodEnoughRatio(old.m_goodEnoughRatio)
{
   assert(m_maxIterations > 0);
   assert(m_minImprovement > 0.0 && m_minImprovement <= 1.0);
   assert(m_goodEnoughRatio >= 0.0);
}